

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  long lVar1;
  u16 *puVar2;
  char **ppcVar3;
  Schema *pSVar4;
  sqlite3_vtab *psVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  VtabCtx *pVVar9;
  VTable *pVTab;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  uint uVar15;
  Schema **ppSVar16;
  long lVar17;
  char *zRight;
  uint uVar18;
  char *zErr;
  VtabCtx sCtx;
  char *local_58;
  VtabCtx local_50;
  
  iVar8 = (pTab->u).tab.addColOffset;
  local_58 = (char *)0x0;
  ppcVar3 = (pTab->u).vtab.azArg;
  for (pVVar9 = db->pVtabCtx; pVVar9 != (VtabCtx *)0x0; pVVar9 = pVVar9->pPrior) {
    if (pVVar9->pTab == pTab) {
      pcVar11 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
      *pzErr = pcVar11;
      return 6;
    }
  }
  pcVar11 = sqlite3DbStrDup(db,pTab->zName);
  iVar7 = 7;
  if (pcVar11 != (char *)0x0) {
    pVTab = (VTable *)sqlite3Malloc(0x30);
    if (pVTab == (VTable *)0x0) {
      sqlite3OomFault(db);
      iVar7 = 7;
    }
    else {
      pVTab->db = (sqlite3 *)0x0;
      pVTab->pMod = (Module *)0x0;
      pVTab->pVtab = (sqlite3_vtab *)0x0;
      pVTab->nRef = 0;
      pVTab->bConstraint = '\0';
      pVTab->eVtabRisk = '\0';
      *(undefined2 *)&pVTab->field_0x1e = 0;
      *(undefined8 *)&pVTab->iSavepoint = 0;
      pVTab->pNext = (VTable *)0x0;
      pVTab->db = db;
      pVTab->pMod = pMod;
      pVTab->eVtabRisk = '\x01';
      if (pTab->pSchema == (Schema *)0x0) {
        lVar10 = -0x8000;
      }
      else {
        lVar10 = -0x100000000;
        ppSVar16 = &db->aDb->pSchema;
        do {
          lVar10 = lVar10 + 0x100000000;
          pSVar4 = *ppSVar16;
          ppSVar16 = ppSVar16 + 4;
        } while (pSVar4 != pTab->pSchema);
        lVar10 = lVar10 >> 0x20;
      }
      ((pTab->u).tab.pFKey)->pNextFrom = (FKey *)db->aDb[lVar10].zDbSName;
      local_50.pPrior = db->pVtabCtx;
      local_50.bDeclared = 0;
      db->pVtabCtx = &local_50;
      local_50.pVTable = pVTab;
      local_50.pTab = pTab;
      iVar7 = (*xConstruct)(db,pMod->pAux,iVar8,ppcVar3,&pVTab->pVtab,&local_58);
      db->pVtabCtx = local_50.pPrior;
      if (iVar7 == 0) {
        psVar5 = pVTab->pVtab;
        iVar7 = 0;
        if (psVar5 != (sqlite3_vtab *)0x0) {
          psVar5->pModule = (sqlite3_module *)0x0;
          *(undefined8 *)&psVar5->nRef = 0;
          psVar5->zErrMsg = (char *)0x0;
          pVTab->pVtab->pModule = pMod->pModule;
          pMod->nRefModule = pMod->nRefModule + 1;
          pVTab->nRef = 1;
          if (local_50.bDeclared == 0) {
            pcVar12 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pTab->zName)
            ;
            *pzErr = pcVar12;
            sqlite3VtabUnlock(pVTab);
            iVar7 = 1;
          }
          else {
            pVTab->pNext = (VTable *)(pTab->u).tab.pDfltList;
            (pTab->u).vtab.p = pVTab;
            if (0 < pTab->nCol) {
              lVar10 = 0;
              uVar6 = 0;
              do {
                pcVar12 = sqlite3ColumnType(pTab->aCol + lVar10,"");
                uVar18 = 0;
                if (pcVar12 != (char *)0x0) {
                  sVar13 = strlen(pcVar12);
                  uVar18 = (uint)sVar13 & 0x3fffffff;
                }
                if (uVar18 != 0) {
                  lVar17 = 0;
                  zRight = pcVar12;
LAB_0016d1a3:
                  iVar8 = sqlite3_strnicmp("hidden",zRight,6);
                  if ((iVar8 != 0) ||
                     (((lVar17 != 0 && (zRight[-1] != ' ')) || ((zRight[6] & 0xdfU) != 0))))
                  goto LAB_0016d1ce;
                  uVar15 = 7 - (zRight[6] == 0);
                  if (uVar15 - (int)lVar17 <= uVar18) {
                    lVar14 = -lVar17;
                    do {
                      pcVar12[lVar14] = pcVar12[lVar14 + (ulong)uVar15];
                      lVar1 = (ulong)uVar15 + lVar14;
                      lVar14 = lVar14 + 1;
                    } while (lVar1 + 1U <= (ulong)uVar18);
                  }
                  if ((lVar17 != 0) && (*zRight == '\0')) {
                    zRight[-1] = '\0';
                  }
                  puVar2 = &pTab->aCol[lVar10].colFlags;
                  *puVar2 = *puVar2 | 2;
                  uVar6 = 0x400;
                  uVar18 = 2;
                  goto LAB_0016d249;
                }
LAB_0016d1d9:
                uVar18 = (uint)uVar6;
LAB_0016d249:
                pTab->tabFlags = pTab->tabFlags | uVar18;
                lVar10 = lVar10 + 1;
              } while (lVar10 < pTab->nCol);
              iVar7 = 0;
            }
          }
        }
      }
      else {
        if (iVar7 == 7) {
          sqlite3OomFault(db);
        }
        if (local_58 == (char *)0x0) {
          pcVar12 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar11);
          *pzErr = pcVar12;
        }
        else {
          pcVar12 = sqlite3MPrintf(db,"%s");
          *pzErr = pcVar12;
          sqlite3_free(local_58);
        }
        sqlite3DbFreeNN(db,pVTab);
      }
    }
    sqlite3DbFreeNN(db,pcVar11);
  }
  return iVar7;
LAB_0016d1ce:
  lVar17 = lVar17 + -1;
  zRight = zRight + 1;
  if (-lVar17 == (ulong)uVar18) goto LAB_0016d1d9;
  goto LAB_0016d1a3;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db,
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg;
  int nArg = pTab->u.vtab.nArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  assert( IsVirtual(pTab) );
  azArg = (const char *const*)pTab->u.vtab.azArg;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db,
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;
  pVTable->eVtabRisk = SQLITE_VTABRISK_Normal;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->u.vtab.azArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pMod->nRefModule++;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u16 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->u.vtab.p. Then loop through the
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->u.vtab.p;
      pTab->u.vtab.p = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          pTab->tabFlags |= TF_HasHidden;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}